

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O3

void __thiscall ClipperLib::Clipper::DoSimplePolygons(Clipper *this)

{
  bool bVar1;
  OutRec *OldOutRec;
  int iVar2;
  OutRec *NewOutRec;
  _func_int **pp_Var3;
  OutPt *op;
  long lVar4;
  OutPt *pOVar5;
  OutRec *OuterOutRec;
  OutPt *pOVar6;
  OutPt *op_00;
  ulong uVar7;
  OutPt *op_1;
  OutPt *pOVar8;
  
  pp_Var3 = this->_vptr_Clipper;
  lVar4 = *(long *)((long)&this->m_ClipType + (long)pp_Var3[-3]);
  if (*(long *)(pp_Var3[-3] +
               (long)&(this->m_Maxima).super__List_base<long_long,_std::allocator<long_long>_>) ==
      lVar4) {
    return;
  }
  uVar7 = 0;
LAB_00291e49:
  OldOutRec = *(OutRec **)(lVar4 + uVar7 * 8);
  pOVar5 = OldOutRec->Pts;
  if ((pOVar5 != (OutPt *)0x0) && (pOVar6 = pOVar5, OldOutRec->IsOpen == false)) {
LAB_00291e6d:
    op_00 = pOVar6->Next;
    if (op_00 != pOVar5) {
LAB_00291e7a:
      if (((((pOVar6->Pt).X == (op_00->Pt).X) && ((pOVar6->Pt).Y == (op_00->Pt).Y)) &&
          (op_00->Next != pOVar6)) && (pOVar5 = op_00->Prev, pOVar5 != pOVar6)) {
        pOVar8 = pOVar6->Prev;
        pOVar6->Prev = pOVar5;
        pOVar5->Next = pOVar6;
        op_00->Prev = pOVar8;
        pOVar8->Next = op_00;
        OldOutRec->Pts = pOVar6;
        NewOutRec = ClipperBase::CreateOutRec
                              ((ClipperBase *)
                               ((long)&this->_vptr_Clipper + (long)this->_vptr_Clipper[-3]));
        NewOutRec->Pts = op_00;
        iVar2 = NewOutRec->Idx;
        pOVar5 = op_00;
        do {
          pOVar5->Idx = iVar2;
          pOVar5 = pOVar5->Prev;
        } while (pOVar5 != op_00);
        pOVar5 = OldOutRec->Pts;
        pOVar8 = op_00;
        do {
          iVar2 = PointInPolygon(&pOVar8->Pt,pOVar5);
          if (-1 < iVar2) {
            pOVar8 = pOVar5;
            if (iVar2 == 0) goto LAB_00291f57;
            break;
          }
          pOVar8 = pOVar8->Next;
        } while (pOVar8 != op_00);
        NewOutRec->IsHole = (bool)(OldOutRec->IsHole ^ 1);
        NewOutRec->FirstLeft = OldOutRec;
        OuterOutRec = OldOutRec;
        op_00 = pOVar6;
        if (this->m_UsingPolyTree != true) goto LAB_00291f44;
        goto LAB_00291f3c;
      }
      goto LAB_00291f44;
    }
    goto LAB_00291ff5;
  }
  goto LAB_00292006;
  while (pOVar8 = pOVar8->Next, pOVar8 != pOVar5) {
LAB_00291f57:
    iVar2 = PointInPolygon(&pOVar8->Pt,op_00);
    if (-1 < iVar2) {
      if (iVar2 == 0) {
        NewOutRec->IsHole = OldOutRec->IsHole;
        NewOutRec->FirstLeft = OldOutRec->FirstLeft;
        op_00 = pOVar6;
        if (this->m_UsingPolyTree == true) {
          FixupFirstLefts1(this,OldOutRec,NewOutRec);
        }
        goto LAB_00291f44;
      }
      break;
    }
  }
  bVar1 = OldOutRec->IsHole;
  NewOutRec->IsHole = bVar1;
  OldOutRec->IsHole = (bool)(bVar1 ^ 1);
  NewOutRec->FirstLeft = OldOutRec->FirstLeft;
  OldOutRec->FirstLeft = NewOutRec;
  OuterOutRec = NewOutRec;
  NewOutRec = OldOutRec;
  op_00 = pOVar6;
  if (this->m_UsingPolyTree == true) {
LAB_00291f3c:
    FixupFirstLefts2(this,NewOutRec,OuterOutRec);
    op_00 = pOVar6;
  }
LAB_00291f44:
  pOVar5 = op_00->Next;
  op_00 = pOVar5;
  if (pOVar5 == OldOutRec->Pts) goto LAB_00291fe6;
  goto LAB_00291e7a;
LAB_00291fe6:
  op_00 = pOVar6->Next;
LAB_00291ff5:
  pOVar6 = op_00;
  if (op_00 == pOVar5) goto code_r0x00291ffe;
  goto LAB_00291e6d;
code_r0x00291ffe:
  pp_Var3 = this->_vptr_Clipper;
LAB_00292006:
  uVar7 = uVar7 + 1;
  lVar4 = *(long *)((long)&this->m_ClipType + (long)pp_Var3[-3]);
  if ((ulong)(*(long *)(pp_Var3[-3] +
                       (long)&(this->m_Maxima).
                              super__List_base<long_long,_std::allocator<long_long>_>) - lVar4 >> 3)
      <= uVar7) {
    return;
  }
  goto LAB_00291e49;
}

Assistant:

void Clipper::DoSimplePolygons()
{
  PolyOutList::size_type i = 0;
  while (i < m_PolyOuts.size()) 
  {
    OutRec* outrec = m_PolyOuts[i++];
    OutPt* op = outrec->Pts;
    if (!op || outrec->IsOpen) continue;
    do //for each Pt in Polygon until duplicate found do ...
    {
      OutPt* op2 = op->Next;
      while (op2 != outrec->Pts) 
      {
        if ((op->Pt == op2->Pt) && op2->Next != op && op2->Prev != op) 
        {
          //split the polygon into two ...
          OutPt* op3 = op->Prev;
          OutPt* op4 = op2->Prev;
          op->Prev = op4;
          op4->Next = op;
          op2->Prev = op3;
          op3->Next = op2;

          outrec->Pts = op;
          OutRec* outrec2 = CreateOutRec();
          outrec2->Pts = op2;
          UpdateOutPtIdxs(*outrec2);
          if (Poly2ContainsPoly1(outrec2->Pts, outrec->Pts))
          {
            //OutRec2 is contained by OutRec1 ...
            outrec2->IsHole = !outrec->IsHole;
            outrec2->FirstLeft = outrec;
            if (m_UsingPolyTree) FixupFirstLefts2(outrec2, outrec);
          }
          else
            if (Poly2ContainsPoly1(outrec->Pts, outrec2->Pts))
          {
            //OutRec1 is contained by OutRec2 ...
            outrec2->IsHole = outrec->IsHole;
            outrec->IsHole = !outrec2->IsHole;
            outrec2->FirstLeft = outrec->FirstLeft;
            outrec->FirstLeft = outrec2;
            if (m_UsingPolyTree) FixupFirstLefts2(outrec, outrec2);
            }
            else
          {
            //the 2 polygons are separate ...
            outrec2->IsHole = outrec->IsHole;
            outrec2->FirstLeft = outrec->FirstLeft;
            if (m_UsingPolyTree) FixupFirstLefts1(outrec, outrec2);
            }
          op2 = op; //ie get ready for the Next iteration
        }
        op2 = op2->Next;
      }
      op = op->Next;
    }
    while (op != outrec->Pts);
  }
}